

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_negative_int<long>(string *text,long *value_p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  char *pcVar5;
  int digit;
  uchar c;
  char *end;
  char *start;
  long vmin_over_base;
  long vmin;
  long value;
  int base;
  long *value_p_local;
  string *text_local;
  
  vmin = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
  start = SUB168((auVar1 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816(10),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
  if (0 < SUB168((auVar2 << 0x40 | ZEXT816(0x8000000000000000)) % SEXT816(10),0)) {
    start = start + 1;
  }
  end = (char *)std::__cxx11::string::data();
  lVar4 = std::__cxx11::string::size();
  pcVar5 = end + lVar4;
  while( true ) {
    if (pcVar5 <= end) {
      *value_p = vmin;
      return true;
    }
    iVar3 = (byte)*end - 0x30;
    if ((9 < iVar3) || (iVar3 < 0)) {
      *value_p = vmin;
      return false;
    }
    if (vmin < (long)start) {
      *value_p = -0x8000000000000000;
      return false;
    }
    if (vmin * 10 < (long)iVar3 + -0x8000000000000000) break;
    vmin = vmin * 10 - (long)iVar3;
    end = end + 1;
  }
  *value_p = -0x8000000000000000;
  return false;
}

Assistant:

bool safe_parse_negative_int(
    const string& text, IntType* value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmin = std::numeric_limits<IntType>::min();
  assert(vmin < 0);
  assert(vmin <= 0 - base);
  IntType vmin_over_base = vmin / base;
  // 2003 c++ standard [expr.mul]
  // "... the sign of the remainder is implementation-defined."
  // Although (vmin/base)*base + vmin%base is always vmin.
  // 2011 c++ standard tightens the spec but we cannot rely on it.
  if (vmin % base > 0) {
    vmin_over_base += 1;
  }
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value < vmin_over_base) {
      *value_p = vmin;
      return false;
    }
    value *= base;
    if (value < vmin + digit) {
      *value_p = vmin;
      return false;
    }
    value -= digit;
  }
  *value_p = value;
  return true;
}